

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

size_t lua_objlen(lua_State *L,int idx)

{
  MSize MVar1;
  TValue *o_00;
  GCstr *pGVar2;
  GCstr *s;
  TValue *o;
  int idx_local;
  lua_State *L_local;
  
  o_00 = index2adr(L,idx);
  if ((int)(o_00->field_4).it >> 0xf == -5) {
    L_local = (lua_State *)(ulong)*(uint *)((o_00->u64 & 0x7fffffffffff) + 0x14);
  }
  else if ((int)(o_00->field_4).it >> 0xf == -0xc) {
    MVar1 = lj_tab_len((GCtab *)(o_00->u64 & 0x7fffffffffff));
    L_local = (lua_State *)(ulong)MVar1;
  }
  else if ((int)(o_00->field_4).it >> 0xf == -0xd) {
    L_local = (lua_State *)(ulong)*(uint *)((o_00->u64 & 0x7fffffffffff) + 0x18);
  }
  else if ((uint)((int)(o_00->field_4).it >> 0xf) < 0xfffffff3) {
    pGVar2 = lj_strfmt_number(L,o_00);
    o_00->u64 = (ulong)pGVar2 | 0xfffd800000000000;
    L_local = (lua_State *)(ulong)pGVar2->len;
  }
  else {
    L_local = (lua_State *)0x0;
  }
  return (size_t)L_local;
}

Assistant:

LUA_API size_t lua_objlen(lua_State *L, int idx)
{
  TValue *o = index2adr(L, idx);
  if (tvisstr(o)) {
    return strV(o)->len;
  } else if (tvistab(o)) {
    return (size_t)lj_tab_len(tabV(o));
  } else if (tvisudata(o)) {
    return udataV(o)->len;
  } else if (tvisnumber(o)) {
    GCstr *s = lj_strfmt_number(L, o);
    setstrV(L, o, s);
    return s->len;
  } else {
    return 0;
  }
}